

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

void transpose64Simple(word *A,word *B)

{
  long lVar1;
  ulong uVar2;
  
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    B[lVar1] = 0;
  }
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    for (uVar2 = 0; uVar2 != 0x40; uVar2 = uVar2 + 1) {
      if ((A[lVar1] >> (uVar2 & 0x3f) & 1) != 0) {
        B[uVar2] = B[uVar2] | 0x8000000000000000U >> ((byte)lVar1 & 0x3f);
      }
    }
  }
  return;
}

Assistant:

void transpose64Simple( word A[64], word B[64] )
{
    int i, k;
    for ( i = 0; i < 64; i++ )
        B[i] = 0;
    for ( i = 0; i < 64; i++ )
    for ( k = 0; k < 64; k++ )
        if ( (A[i] >> k) & 1 )
            B[k] |= ((word)1 << (63-i));
}